

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_bitmask_format_text(la_vstring *vstr,uint8_t bitmask,la_dict *dict,int indent)

{
  void *pvVar1;
  uint in_ECX;
  la_dict *in_RDX;
  byte in_SIL;
  la_vstring *in_RDI;
  char *name;
  int i;
  int local_20;
  
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    if (((uint)in_SIL & 1 << ((byte)local_20 & 0x1f)) != 0) {
      pvVar1 = la_dict_search(in_RDX,local_20);
      if (pvVar1 == (void *)0x0) {
        la_vstring_append_sprintf
                  (in_RDI,"%*sunknown (%u)\n",(ulong)in_ECX,"",
                   (ulong)(uint)(1 << ((byte)local_20 & 0x1f)));
      }
      else {
        la_vstring_append_sprintf(in_RDI,"%*s%s\n",(ulong)in_ECX,"",pvVar1);
      }
    }
  }
  return;
}

Assistant:

static void la_miam_bitmask_format_text(la_vstring *vstr, uint8_t bitmask,
		la_dict const *dict, int indent) {
	la_assert(vstr != NULL);
	la_assert(dict != NULL);
	la_assert(indent >= 0);

	for(int i = 0; i < 8; i++) {
		if((bitmask & (1 << i)) != 0) {
			char *name = la_dict_search(dict, i);
			if(name != NULL) {
				LA_ISPRINTF(vstr, indent, "%s\n", name);
			} else {
				LA_ISPRINTF(vstr, indent, "unknown (%u)\n", 1 << i);
			}
		}
	}
}